

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeString::swap(UnicodeString *this,UnicodeString *other)

{
  UnicodeString temp;
  UnicodeString local_58;
  
  local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003febe0;
  local_58.fUnion.fStackFields.fLengthAndFlags = 2;
  copyFieldsFrom(&local_58,this,'\0');
  copyFieldsFrom(this,other,'\0');
  (other->fUnion).fStackFields.fLengthAndFlags = local_58.fUnion.fStackFields.fLengthAndFlags;
  if ((local_58.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
    (other->fUnion).fFields.fArray = local_58.fUnion.fFields.fArray;
    (other->fUnion).fFields.fCapacity = local_58.fUnion.fFields.fCapacity;
    if (local_58.fUnion.fStackFields.fLengthAndFlags < 0) {
      (other->fUnion).fFields.fLength = local_58.fUnion.fFields.fLength;
    }
  }
  else if (&local_58 != other) {
    memcpy((void *)((long)&other->fUnion + 2),(void *)((long)&local_58.fUnion + 2),
           (long)(((int)local_58.fUnion.fStackFields.fLengthAndFlags >> 5) * 2));
  }
  local_58.fUnion.fStackFields.fLengthAndFlags = 2;
  ~UnicodeString(&local_58);
  return;
}

Assistant:

void UnicodeString::swap(UnicodeString &other) U_NOEXCEPT {
  UnicodeString temp;  // Empty short string: Known not to need releaseArray().
  // Copy fields without resetting source values in between.
  temp.copyFieldsFrom(*this, FALSE);
  this->copyFieldsFrom(other, FALSE);
  other.copyFieldsFrom(temp, FALSE);
  // Set temp to an empty string so that other's memory is not released twice.
  temp.fUnion.fFields.fLengthAndFlags = kShortString;
}